

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

bool IsVirtualFunctionCall(ExpressionContext *ctx,FunctionData *function,TypeBase *type)

{
  TypeClass *classType;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  InplaceStr IVar4;
  
  if (function == (FunctionData *)0x0) {
    __assert_fail("function",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x19ba,
                  "bool IsVirtualFunctionCall(ExpressionContext &, FunctionData *, TypeBase *)");
  }
  if (ctx->typeAutoRef == (TypeStruct *)type) {
    bVar1 = true;
  }
  else {
    if ((((type != (TypeBase *)0x0) && (type->typeID == 0x12)) &&
        (classType = (TypeClass *)type[1]._vptr_TypeBase, classType != (TypeClass *)0x0)) &&
       (((classType->super_TypeStruct).super_TypeBase.typeID == 0x18 &&
        ((classType->extendable != false || (classType->baseClass != (TypeClass *)0x0)))))) {
      uVar2 = NULLC::StringHashContinue((classType->super_TypeStruct).super_TypeBase.nameHash,"::");
      IVar4 = GetTypeConstructorName(classType);
      uVar3 = NULLC::StringHashContinue(uVar2,IVar4.begin,IVar4.end);
      uVar2 = function->nameHash;
      if (uVar2 != uVar3) {
        uVar3 = NULLC::StringHashContinue(uVar3,"$");
        return uVar2 != uVar3;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool IsVirtualFunctionCall(ExpressionContext &ctx, FunctionData *function, TypeBase *type)
{
	assert(function);

	if(type == ctx.typeAutoRef)
		return true;

	if(TypeRef *refType = getType<TypeRef>(type))
	{
		if(TypeClass *classType = getType<TypeClass>(refType->subType))
		{
			if(classType->extendable || classType->baseClass != NULL)
			{
				unsigned hash = NULLC::StringHashContinue(classType->nameHash, "::");

				InplaceStr constructor = GetTypeConstructorName(classType);

				hash = NULLC::StringHashContinue(hash, constructor.begin, constructor.end);

				if(function->nameHash == hash || function->nameHash == NULLC::StringHashContinue(hash, "$"))
					return false;

				return true;
			}
		}
	}

	return false;
}